

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::print_lda_features(vw *all,example *ec)

{
  bool bVar1;
  size_t sVar2;
  features_value_index_audit_iterator *this;
  parameters *this_00;
  __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var3;
  element_type *peVar4;
  ulong *puVar5;
  feature_value *pfVar6;
  weight *pwVar7;
  ostream *poVar8;
  int __c;
  int __c_00;
  undefined8 in_RSI;
  char *pcVar9;
  long in_RDI;
  size_t k;
  iterator_all *f;
  iterator_all __end2;
  iterator_all __begin2;
  features_value_index_audit_range *__range2;
  features *fs_1;
  iterator __end1_1;
  iterator __begin1_1;
  example *__range1_1;
  features *fs;
  iterator __end1;
  iterator __begin1;
  example *__range1;
  size_t count;
  uint32_t stride_shift;
  parameters *weights;
  parameters *in_stack_fffffffffffffef8;
  example_predict *in_stack_ffffffffffffff00;
  ostream *in_stack_ffffffffffffff18;
  ulong local_d8;
  features_value_iterator local_c8 [3];
  features_value_index_audit_iterator local_b0;
  features *local_98;
  features **local_90;
  features *local_88;
  iterator local_80;
  iterator local_70;
  undefined8 local_60;
  features *local_58;
  iterator local_50;
  iterator local_40;
  undefined8 local_30;
  ulong local_28;
  uint32_t local_1c;
  parameters *local_18;
  undefined8 local_10;
  long local_8;
  
  local_18 = (parameters *)(in_RDI + 0x3590);
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_1c = parameters::stride_shift(in_stack_fffffffffffffef8);
  local_28 = 0;
  local_30 = local_10;
  local_40 = example_predict::begin(in_stack_ffffffffffffff00);
  local_50 = example_predict::end(in_stack_ffffffffffffff00);
  while( true ) {
    bVar1 = example_predict::iterator::operator!=(&local_40,&local_50);
    if (!bVar1) break;
    local_58 = example_predict::iterator::operator*(&local_40);
    sVar2 = features::size((features *)0x161924);
    local_28 = sVar2 + local_28;
    example_predict::iterator::operator++(&local_40);
  }
  local_60 = local_10;
  local_70 = example_predict::begin(in_stack_ffffffffffffff00);
  local_80 = example_predict::end(in_stack_ffffffffffffff00);
  while( true ) {
    bVar1 = example_predict::iterator::operator!=(&local_70,&local_80);
    if (!bVar1) break;
    local_88 = example_predict::iterator::operator*(&local_70);
    local_98 = (features *)features::values_indices_audit((features *)in_stack_fffffffffffffef8);
    local_90 = &local_98;
    features::features_value_index_audit_range::begin
              ((features_value_index_audit_range *)in_stack_ffffffffffffff18);
    features::features_value_index_audit_range::end
              ((features_value_index_audit_range *)in_stack_ffffffffffffff18);
    while( true ) {
      bVar1 = features_value_iterator::operator!=((features_value_iterator *)&local_b0,local_c8);
      if (!bVar1) break;
      this = features_value_index_audit_iterator::operator*(&local_b0);
      this_00 = (parameters *)std::operator<<((ostream *)&std::cout,'\t');
      p_Var3 = &features_value_index_audit_iterator::audit_abi_cxx11_(this)->
                super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ;
      peVar4 = std::
               __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ::get(p_Var3);
      poVar8 = std::operator<<((ostream *)this_00,(string *)peVar4);
      poVar8 = std::operator<<(poVar8,'^');
      p_Var3 = &features_value_index_audit_iterator::audit_abi_cxx11_(this)->
                super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ;
      peVar4 = std::
               __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ::get(p_Var3);
      poVar8 = std::operator<<(poVar8,(string *)&peVar4->second);
      pcVar9 = (char *)0x3a;
      in_stack_ffffffffffffff18 = std::operator<<(poVar8,':');
      puVar5 = (ulong *)features_value_index_iterator::index
                                  (&this->super_features_value_index_iterator,pcVar9,__c);
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (in_stack_ffffffffffffff18,
                          *puVar5 >> ((byte)local_1c & 0x3f) & *(ulong *)(local_8 + 0x358));
      poVar8 = std::operator<<(poVar8,':');
      pfVar6 = features_value_iterator::value((features_value_iterator *)this);
      std::ostream::operator<<(poVar8,*pfVar6);
      for (local_d8 = 0; local_d8 < *(uint *)(local_8 + 0x3478); local_d8 = local_d8 + 1) {
        pcVar9 = (char *)0x3a;
        in_stack_ffffffffffffff00 = (example_predict *)std::operator<<((ostream *)&std::cout,':');
        in_stack_fffffffffffffef8 = local_18;
        features_value_index_iterator::index
                  (&this->super_features_value_index_iterator,pcVar9,__c_00);
        pwVar7 = parameters::operator[](this_00,(size_t)in_stack_ffffffffffffff00);
        std::ostream::operator<<(in_stack_ffffffffffffff00,pwVar7[local_d8]);
      }
      features_value_index_audit_iterator::operator++
                ((features_value_index_audit_iterator *)in_stack_ffffffffffffff00);
    }
    example_predict::iterator::operator++(&local_70);
  }
  poVar8 = std::operator<<((ostream *)&std::cout," total of ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_28);
  poVar8 = std::operator<<(poVar8," features.");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_lda_features(vw& all, example& ec)
{
  parameters& weights = all.weights;
  uint32_t stride_shift = weights.stride_shift();
  size_t count = 0;
  for (features& fs : ec) count += fs.size();
  for (features& fs : ec)
  {
    for (features::iterator_all& f : fs.values_indices_audit())
    {
      cout << '\t' << f.audit().get()->first << '^' << f.audit().get()->second << ':'
           << ((f.index() >> stride_shift) & all.parse_mask) << ':' << f.value();
      for (size_t k = 0; k < all.lda; k++) cout << ':' << (&weights[f.index()])[k];
    }
  }
  cout << " total of " << count << " features." << endl;
}